

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O2

void __thiscall LinearRegression::loadFeatures(LinearRegression *this)

{
  bool bVar1;
  int iVar2;
  size_t *__s;
  istream *piVar3;
  size_t sVar4;
  Feature *this_00;
  int iVar5;
  int numOfFeatures;
  int degreeOfInteractions;
  size_t local_7d8;
  string rootName;
  string attrName;
  undefined1 local_790 [32];
  string typeOfFeature;
  string line;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_708;
  int *local_700 [2];
  stringstream ssLine;
  ostream local_6e0 [376];
  Feature f;
  ifstream input;
  byte abStack_218 [488];
  
  __s = (size_t *)operator_new__(800);
  memset(__s,0,800);
  this->_queryRootIndex = __s;
  std::ifstream::ifstream(&input,(string *)multifaq::config::FEATURE_CONF_abi_cxx11_,_S_in);
  if ((abStack_218[*(long *)(_input + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)&ssLine);
    numOfFeatures = 0;
    degreeOfInteractions = 0;
    do {
      do {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&input,(string *)&line);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) goto LAB_0014798d;
      } while (*line._M_dataplus._M_p == '#');
      bVar1 = std::operator==(&line,"");
    } while (bVar1);
LAB_0014798d:
    local_708._M_current = line._M_dataplus._M_p;
    rootName._M_dataplus._M_p = (pointer)&numOfFeatures;
    typeOfFeature._M_string_length = (size_type)&rootName;
    attrName._M_dataplus._M_p = (pointer)&typeOfFeature;
    typeOfFeature._M_dataplus._M_p = &boost::spirit::int_;
    f.head.super__Base_bitset<2UL>._M_w[0] = (_WordT)&attrName;
    attrName._M_string_length = (size_type)&NUMBER_SEPARATOR_CHAR;
    local_700[0] = &degreeOfInteractions;
    local_790._8_8_ = local_700;
    f.head.super__Base_bitset<2UL>._M_w[1] = (_WordT)local_790;
    local_790._0_8_ = &boost::spirit::int_;
    iVar5 = 0;
    boost::spirit::qi::
    phrase_parse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>>
              (&local_708,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(line._M_dataplus._M_p + line._M_string_length),
               (expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
                *)&f,(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
                      *)&boost::spirit::ascii::space,postskip);
    while( true ) {
      do {
        do {
          if (numOfFeatures <= iVar5) {
            std::__cxx11::stringstream::~stringstream((stringstream *)&ssLine);
            std::__cxx11::string::~string((string *)&line);
            std::ifstream::~ifstream(&input);
            return;
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&input,(string *)&line);
        } while (*line._M_dataplus._M_p == '#');
        bVar1 = std::operator==(&line,"");
      } while (bVar1);
      std::operator<<(local_6e0,(string *)&line);
      attrName._M_dataplus._M_p = (pointer)&attrName.field_2;
      attrName._M_string_length = 0;
      attrName.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ssLine,(string *)&attrName,':');
      typeOfFeature._M_dataplus._M_p = (pointer)&typeOfFeature.field_2;
      typeOfFeature._M_string_length = 0;
      typeOfFeature.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ssLine,(string *)&typeOfFeature,':');
      rootName._M_dataplus._M_p = (pointer)&rootName.field_2;
      rootName._M_string_length = 0;
      rootName.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ssLine,(string *)&rootName,':');
      sVar4 = TreeDecomposition::getAttributeIndex
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &attrName);
      iVar2 = std::__cxx11::stoi(&typeOfFeature,(size_t *)0x0,10);
      local_7d8 = TreeDecomposition::getRelationIndex
                            ((this->_td).
                             super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,&rootName);
      if ((int)sVar4 == -1) break;
      if ((int)local_7d8 == -1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_790,"Relation |",&rootName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_790,"| does not exist.");
        std::operator<<((ostream *)&std::cerr,(string *)&f);
        goto LAB_00147dc7;
      }
      if (iVar2 == 1 && iVar5 == 0) {
        std::operator<<((ostream *)&std::cerr,"The label needs to be continuous! ");
        goto LAB_00147df3;
      }
      sVar4 = (size_t)(int)sVar4;
      std::bitset<100UL>::set(&(this->super_Application)._isFeature,sVar4,true);
      std::bitset<100UL>::set(&(this->super_Application)._features,sVar4,true);
      memset(&f,0,0x330);
      if (iVar2 == 0) {
        this->_queryRootIndex[sVar4] =
             ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_root->_id;
        f.body[sVar4] = f.body[sVar4] + 1;
      }
      else {
        std::bitset<100UL>::set(&this->_categoricalFeatures,sVar4,true);
        this->_queryRootIndex[sVar4] = (long)(int)local_7d8;
        std::bitset<100UL>::set(&f.head,sVar4,true);
        std::bitset<100UL>::set(&(this->super_Application)._isCategoricalFeature,sVar4,true);
      }
      std::vector<Feature,_std::allocator<Feature>_>::push_back
                (&(this->super_Application)._listOfFeatures,&f);
      if (iVar5 == 0) {
        this->labelID = sVar4;
      }
      std::ios::clear((int)*(undefined8 *)(_ssLine - 0x18) + (int)&ssLine);
      std::__cxx11::string::~string((string *)&rootName);
      std::__cxx11::string::~string((string *)&typeOfFeature);
      std::__cxx11::string::~string((string *)&attrName);
      iVar5 = iVar5 + 1;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_790,
                   "Attribute |",&attrName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_790,
                   "| does not exist.");
    std::operator<<((ostream *)&std::cerr,(string *)&f);
LAB_00147dc7:
    std::__cxx11::string::~string((string *)&f);
    this_00 = (Feature *)local_790;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multifaq::config::FEATURE_CONF_abi_cxx11_," does not exist. \n");
    std::operator<<((ostream *)&std::cerr,(string *)&f);
    this_00 = &f;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00147df3:
  exit(1);
}

Assistant:

void LinearRegression::loadFeatures()
{
    _queryRootIndex = new size_t[NUM_OF_VARIABLES]();
    
    /* Load the two-pass variables config file into an input stream. */
    ifstream input(FEATURE_CONF);

    if (!input)
    {
        ERROR(FEATURE_CONF+" does not exist. \n");
        exit(1);
    }

    /* String and associated stream to receive lines from the file. */
    string line;
    stringstream ssLine;

    int numOfFeatures = 0;
    int degreeOfInteractions = 0;
    
    /* Ignore comment and empty lines at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;

        break;
    }
    
    /* 
     * Extract number of labels, features and interactions from the config. 
     * Parse the line with the three numbers; ignore spaces. 
     */
    bool parsingSuccess =
        qi::phrase_parse(line.begin(), line.end(),

                         /* Begin Boost Spirit grammar. */
                         ((qi::int_[phoenix::ref(numOfFeatures) = qi::_1])
                          >> NUMBER_SEPARATOR_CHAR
                          >> (qi::int_[phoenix::ref(degreeOfInteractions) =
                                       qi::_1])),
                         /*  End grammar. */
                         ascii::space);

    assert(parsingSuccess && "The parsing of the features file has failed.");
    
    /* Read in the features. */
    for (int featureNo = 0; featureNo < numOfFeatures; ++featureNo)
    {
        getline(input, line);
        if (line[0] == COMMENT_CHAR || line == "")
        {
            --featureNo;
            continue;
        }

        ssLine << line;
 
        string attrName;
        /* Extract the name of the attribute in the current line. */
        getline(ssLine, attrName, ATTRIBUTE_NAME_CHAR);

        string typeOfFeature;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, typeOfFeature, ATTRIBUTE_NAME_CHAR);

        string rootName;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, rootName, ATTRIBUTE_NAME_CHAR);

        int attributeID = _td->getAttributeIndex(attrName);
        int categorical = stoi(typeOfFeature); 
        int rootID = _td->getRelationIndex(rootName);

        if (attributeID == -1)
        {
            ERROR("Attribute |"+attrName+"| does not exist.");
            exit(1);
        }

        if (rootID == -1)
        {
            ERROR("Relation |"+rootName+"| does not exist.");
            exit(1);
        }

        if (featureNo == 0 && categorical == 1)
        {
            ERROR("The label needs to be continuous! ");
            exit(1);
        }

        _isFeature.set(attributeID);
        _features.set(attributeID);

        Feature f;

        if (categorical)
        {
            _categoricalFeatures.set(attributeID);
            _queryRootIndex[attributeID] = rootID;

            f.head.set(attributeID);
            _isCategoricalFeature.set(attributeID);
        }
        else
        {
            _queryRootIndex[attributeID] = _td->_root->_id;
            ++f.body[attributeID];
        }

        _listOfFeatures.push_back(f);

        if (featureNo == 0)
            labelID = attributeID;
        
        /* Clear string stream. */
        ssLine.clear();
    }
}